

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,double *f)

{
  bool bVar1;
  QTextStreamPrivate *this_00;
  undefined8 *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  double tmp;
  QTextStreamPrivate *in_stack_00000040;
  undefined4 in_stack_ffffffffffffff98;
  Status in_stack_ffffffffffffff9c;
  QTextStream *in_stack_ffffffffffffffa0;
  QTextStream *local_38;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4ab1f4);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QMessageLogger::warning(&local_28,"QTextStream: No device");
    local_38 = in_RDI;
  }
  else {
    bVar1 = QTextStreamPrivate::getReal(in_stack_00000040,(double *)tmp);
    if (bVar1) {
      *in_RSI = 0xffffffffffffffff;
      local_38 = in_RDI;
    }
    else {
      *in_RSI = 0;
      atEnd(in_stack_ffffffffffffffa0);
      setStatus(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_38 = in_RDI;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(double &f)
{
    IMPLEMENT_STREAM_RIGHT_REAL_OPERATOR(double);
}